

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SearchableObjectHolder.hpp
# Opt level: O2

bool __thiscall
gmlc::concurrency::SearchableObjectHolder<helics::Broker,_helics::CoreType>::removeObject
          (SearchableObjectHolder<helics::Broker,_helics::CoreType> *this,
          function<bool_(const_std::shared_ptr<helics::Broker>_&)> *operand)

{
  bool bVar1;
  iterator __position;
  iterator __position_00;
  
  CLI::std::mutex::lock((mutex *)this);
  __position._M_node = *(_Base_ptr *)(this + 0x40);
  do {
    if (__position._M_node == (_Base_ptr)(this + 0x30)) {
LAB_002782e5:
      pthread_mutex_unlock((pthread_mutex_t *)this);
      return __position._M_node != (_Base_ptr)(this + 0x30);
    }
    bVar1 = std::function<bool_(const_std::shared_ptr<helics::Broker>_&)>::operator()
                      (operand,(shared_ptr<helics::Broker> *)(__position._M_node + 2));
    if (bVar1) {
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<helics::Broker>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<helics::Broker>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<helics::Broker>>>>
      ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<helics::Broker>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<helics::Broker>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<helics::Broker>>>>
                          *)(this + 0x28),__position);
      __position_00 =
           std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<helics::CoreType,_std::allocator<helics::CoreType>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<helics::CoreType,_std::allocator<helics::CoreType>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<helics::CoreType,_std::allocator<helics::CoreType>_>_>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<helics::CoreType,_std::allocator<helics::CoreType>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<helics::CoreType,_std::allocator<helics::CoreType>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<helics::CoreType,_std::allocator<helics::CoreType>_>_>_>_>
                   *)(this + 0x58),__position._M_node + 1);
      if (__position_00._M_node != (_Base_ptr)(this + 0x60)) {
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<helics::CoreType,std::allocator<helics::CoreType>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<helics::CoreType,std::allocator<helics::CoreType>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<helics::CoreType,std::allocator<helics::CoreType>>>>>
        ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<helics::CoreType,std::allocator<helics::CoreType>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<helics::CoreType,std::allocator<helics::CoreType>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<helics::CoreType,std::allocator<helics::CoreType>>>>>
                            *)(this + 0x58),__position_00);
      }
      goto LAB_002782e5;
    }
    __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
  } while( true );
}

Assistant:

bool removeObject(std::function<bool(const std::shared_ptr<X>&)> operand)
    {
        std::lock_guard<std::mutex> lock(mapLock);
        for (auto obj = objectMap.begin(); obj != objectMap.end(); ++obj) {
            if (operand(obj->second)) {
                objectMap.erase(obj);
                auto fnd2 = typeMap.find(obj->first);
                if (fnd2 != typeMap.end()) {
                    typeMap.erase(fnd2);
                }
                return true;
            }
        }
        return false;
    }